

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewEdgeCalculator.cpp
# Opt level: O1

void __thiscall
NewEdgeCalculator::calculateProb0(NewEdgeCalculator *this,mapValue *val1,double *res)

{
  double dVar1;
  ulong uVar2;
  
  dVar1 = (this->SIMPSON_MAP).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[val1->ref];
  uVar2 = -(ulong)(dVar1 != 0.0);
  *res = (double)(~uVar2 & 0xbfe34413509f79ff | (ulong)dVar1 & uVar2) + *res;
  return;
}

Assistant:

void NewEdgeCalculator::calculateProb0(const AlignmentRecord::mapValue & val1, double& res) const{
    //find positions which are non common positions and look up probability in empirical allele frequency distribution
    //const auto& k = this->SIMPSON_MAP.find(val1.ref);
    auto d = this->SIMPSON_MAP[val1.ref];
    if (d!=0){
        res+=d;
    //if (k != this->SIMPSON_MAP.end()){
    //    res *= k->second;
    } else {
        res +=std::log10(0.25);
    }

}